

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::~raft_server(raft_server *this)

{
  _Atomic_word *p_Var1;
  EventAwaiter *pEVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Manager_type p_Var4;
  int iVar5;
  nuraft_global_mgr *this_00;
  long lVar6;
  unique_lock<std::mutex> commit_lock;
  unique_lock<std::mutex> lock;
  unique_lock<std::recursive_mutex> guard;
  unique_lock<std::mutex> local_58;
  unique_lock<std::mutex> local_48;
  unique_lock<std::recursive_mutex> local_38;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  
  this->_vptr_raft_server = (_func_int **)&PTR__raft_server_005c4940;
  this_00 = nuraft_global_mgr::get_instance();
  if (this_00 != (nuraft_global_mgr *)0x0) {
    nuraft_global_mgr::close_raft_server(this_00,this);
  }
  local_38._M_device = &this->lock_;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  local_38._M_owns = true;
  LOCK();
  (this->stopping_)._M_base._M_i = true;
  UNLOCK();
  local_58._M_device = &this->commit_cv_lock_;
  local_58._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_58);
  local_58._M_owns = true;
  std::condition_variable::notify_all();
  local_48._M_device = &this->ready_to_stop_cv_lock_;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  std::unique_lock<std::mutex>::unlock(&local_58);
  local_58._M_device = (mutex_type *)0x0;
  local_58._M_owns = false;
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_28.__d.__r = (duration)(lVar6 + 10000000);
  std::condition_variable::__wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&this->ready_to_stop_cv_,&local_48,&local_28);
  cancel_schedulers(this);
  pEVar2 = this->bg_append_ea_;
  if (pEVar2 != (EventAwaiter *)0x0) {
    std::condition_variable::~condition_variable(&pEVar2->cv);
    operator_delete(pEVar2);
  }
  pEVar2 = this->ea_sm_commit_exec_in_progress_;
  if (pEVar2 != (EventAwaiter *)0x0) {
    std::condition_variable::~condition_variable(&pEVar2->cv);
    operator_delete(pEVar2);
  }
  pEVar2 = this->ea_follower_log_append_;
  if (pEVar2 != (EventAwaiter *)0x0) {
    std::condition_variable::~condition_variable(&pEVar2->cv);
    operator_delete(pEVar2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  p_Var3 = (this->last_snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var4 = (this->ex_resp_handler_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->ex_resp_handler_,(_Any_data *)&this->ex_resp_handler_,
              __destroy_functor);
  }
  p_Var4 = (this->resp_handler_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->resp_handler_,(_Any_data *)&this->resp_handler_,__destroy_functor)
    ;
  }
  std::condition_variable::~condition_variable(&this->ready_to_stop_cv_);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  ::~_Rb_tree(&(this->commit_ret_elems_)._M_t);
  std::condition_variable::~condition_variable(&this->commit_cv_);
  p_Var3 = (this->conf_to_add_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->uncommitted_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->stale_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var4 = (this->rand_timeout_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->rand_timeout_,(_Any_data *)&this->rand_timeout_,__destroy_functor)
    ;
  }
  p_Var3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::__cxx11::
  _List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ::_M_clear(&(this->auto_fwd_reqs_).
              super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
            );
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->auto_fwd_pkgs_)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->rpc_clients_)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->peers_)._M_h);
  p_Var3 = (this->election_task_).
           super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var4 = (this->election_exec_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->election_exec_,(_Any_data *)&this->election_exec_,
              __destroy_functor);
  }
  p_Var3 = (this->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::~unique_ptr(&this->ctx_);
  if (((this->bg_append_thread_)._M_id._M_thread == 0) &&
     ((this->bg_commit_thread_)._M_id._M_thread == 0)) {
    p_Var3 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
             super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])();
      }
    }
    return;
  }
  std::terminate();
}

Assistant:

raft_server::~raft_server() {
    // For the case that user does not call shutdown() and directly
    // destroy the current `raft_server` instance.
    cancel_global_requests();

    recur_lock(lock_);
    stopping_ = true;
    std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
    commit_cv_.notify_all();
    std::unique_lock<std::mutex> lock(ready_to_stop_cv_lock_);
    commit_lock.unlock();
    commit_lock.release();
    ready_to_stop_cv_.wait_for(lock, std::chrono::milliseconds(10));
    cancel_schedulers();
    delete bg_append_ea_;
    delete ea_sm_commit_exec_in_progress_;
    delete ea_follower_log_append_;
}